

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

VirtualIterator<Inferences::InductionContext> __thiscall
Inferences::InductionContextFn::operator()
          (InductionContextFn *this,
          pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
          *arg)

{
  int *piVar1;
  Inference *pIVar2;
  long *plVar3;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *this_01;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *this_02;
  pointer ppTVar4;
  Term *term;
  void *pvVar5;
  undefined8 uVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  void **head;
  Literal *val;
  Clause *pCVar11;
  ulong uVar12;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *in_RDX;
  SingletonIterator<Inferences::InductionContext> *i;
  CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
  *i_00;
  uint uVar13;
  TermList st1;
  TermList st2;
  SubtermIterator sti2;
  bool dummy;
  SubtermIterator sti1;
  Set<Kernel::Literal_*,_Inferences::SharedTermHash> lits;
  InductionContext ctx;
  VirtualIterator<Inferences::InductionContext> local_410;
  Term *local_408;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [24];
  pointer local_3d8;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3d0;
  long *local_398;
  undefined1 local_390 [48];
  size_type local_360;
  _Prime_rehash_policy local_358 [2];
  undefined1 local_338 [24];
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_320;
  SubtermIterator local_2e8;
  bool local_2c0 [8];
  pointer local_2b8;
  pointer ppTStack_2b0;
  pointer local_2a8;
  _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2a0;
  SubtermIterator local_268;
  SingletonIterator<Inferences::InductionContext> local_240;
  SingletonIterator<Inferences::InductionContext> local_1e8;
  InductionContext local_190;
  InductionContext local_140;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>_>
  local_f0;
  SingletonIterator<Inferences::InductionContext> local_88;
  
  pCVar11 = (Clause *)
            (arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  uVar13 = *(uint *)&(pCVar11->super_Unit)._inference >> 0x15 & 0x1f;
  if (uVar13 == 0) {
    InductionContext::InductionContext
              ((InductionContext *)local_390,in_RDX,
               (Literal *)
               (arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,pCVar11);
    local_240._finished = false;
    local_240._1_7_ = 0;
    local_240._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_240._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::expand
              ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_240);
    local_400._0_8_ =
         (arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ::Lib::Set<Kernel::Literal*,Inferences::SharedTermHash>::
    rawFindOrInsert<Lib::Set<Kernel::Literal*,Inferences::SharedTermHash>::insert(Kernel::Literal*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Literal*,Inferences::SharedTermHash>::insert(Kernel::Literal*,unsigned_int)::_lambda(auto:1)_1_>
              ((Set<Kernel::Literal*,Inferences::SharedTermHash> *)&local_240,
               (anon_class_8_1_ba1d8281)local_400,*(uint *)(local_400._0_8_ + 0x2c),
               (anon_class_8_1_ba1d8281)local_400,local_2c0);
    while( true ) {
      cVar7 = (**(code **)&(*in_RDX[1].
                             super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_weight)();
      if (cVar7 == '\0') break;
      (**(code **)&(*in_RDX[1].super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                     _M_impl.super__Vector_impl_data._M_start)->_maxRedLen)(local_400);
      uVar6 = auStack_3f0._0_8_;
      if ((((__hashtable_alloc *)local_400._0_8_ != (__hashtable_alloc *)0x0) &&
          ((IteratorCore<Inferences::InductionContext> *)local_400._8_8_ !=
           (IteratorCore<Inferences::InductionContext> *)0x0)) &&
         (*(int *)(_func_int ***)local_400._8_8_ = *(int *)(_func_int ***)local_400._8_8_ + -1,
         *(int *)(_func_int ***)local_400._8_8_ == 0)) {
        (**(code **)&(*(Term **)local_400._0_8_)->_functor)();
        if ((IteratorCore<Inferences::InductionContext> *)local_400._8_8_ !=
            (IteratorCore<Inferences::InductionContext> *)0x0) {
          *(_func_int ***)local_400._8_8_ =
               (_func_int **)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_400._8_8_;
        }
      }
      bVar9 = ::Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::contains
                        ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_240,
                         *(Literal **)(uVar6 + 0x10));
      if (!bVar9) {
        val = Kernel::Literal::complementaryLiteral(*(Literal **)(uVar6 + 0x10));
        bVar9 = ::Lib::Set<Kernel::Literal_*,_Inferences::SharedTermHash>::contains
                          ((Set<Kernel::Literal_*,_Inferences::SharedTermHash> *)&local_240,val);
        if (!bVar9) {
          local_400._0_8_ = *(undefined8 *)(uVar6 + 0x10);
          ::Lib::Set<Kernel::Literal*,Inferences::SharedTermHash>::
          rawFindOrInsert<Lib::Set<Kernel::Literal*,Inferences::SharedTermHash>::insert(Kernel::Literal*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Literal*,Inferences::SharedTermHash>::insert(Kernel::Literal*,unsigned_int)::_lambda(auto:1)_1_>
                    ((Set<Kernel::Literal*,Inferences::SharedTermHash> *)&local_240,
                     (anon_class_8_1_ba1d8281)local_400,*(uint *)(local_400._0_8_ + 0x2c),
                     (anon_class_8_1_ba1d8281)local_400,local_2c0);
          if ((*(ushort *)&((*(Clause **)(uVar6 + 0x18))->super_Unit)._inference.field_0x2 & 0x3e0)
              == 0) {
            InductionContext::insert
                      ((InductionContext *)local_390,*(Clause **)(uVar6 + 0x18),
                       *(Literal **)(uVar6 + 0x10));
          }
        }
      }
    }
    std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::vector
              (&local_140._indTerms,
               (vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)local_390);
    this_01 = &local_140._cls;
    local_140._cls._M_h._M_buckets = (__buckets_ptr)0x0;
    local_140._cls._M_h._M_bucket_count = local_390._32_8_;
    local_140._cls._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_140._cls._M_h._M_element_count = local_360;
    local_140._cls._M_h._M_rehash_policy._M_max_load_factor = local_358[0]._M_max_load_factor;
    local_140._cls._M_h._M_rehash_policy._4_4_ = local_358[0]._4_4_;
    local_140._cls._M_h._M_rehash_policy._M_next_resize = local_358[0]._M_next_resize;
    local_140._cls._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_400._0_8_ = this_01;
    std::
    _Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,true>>>>
              ((_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,
               (_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)(local_390 + 0x18),
               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>_>_>
                *)local_400);
    ::Lib::getSingletonIterator<Inferences::InductionContext>(&local_88,&local_140);
    pCVar11 = (Clause *)::operator_new(0x68,8);
    this_02 = &local_88._el._cls;
    this_00 = (_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(auStack_3f0 + 0x10);
    local_400[0] = local_88._finished;
    local_400._8_8_ =
         local_88._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    auStack_3f0._0_8_ =
         local_88._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    auStack_3f0._8_8_ =
         local_88._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(this_00,this_02,this_02);
    *(undefined4 *)&(pCVar11->super_Unit)._inference = 0;
    *(undefined ***)&pCVar11->super_Unit = &PTR__ProxyIterator_00b65498;
    (pCVar11->super_Unit)._inference.field_0x8 = local_400[0];
    (pCVar11->super_Unit)._inference._splits = (SplitSet *)local_400._8_8_;
    (pCVar11->super_Unit)._inference._ptr1 = (void *)auStack_3f0._0_8_;
    (pCVar11->super_Unit)._inference._ptr2 = (void *)auStack_3f0._8_8_;
    auStack_3f0._8_8_ = (pointer)0x0;
    local_400._8_8_ = (IteratorCore<Inferences::InductionContext> *)0x0;
    auStack_3f0._0_8_ = 0;
    std::
    _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&(pCVar11->super_Unit)._inference.th_ancestors,this_00,this_00);
    this->_premise = pCVar11;
    pIVar2 = &(pCVar11->super_Unit)._inference;
    *(int *)pIVar2 = *(int *)pIVar2 + 1;
    std::
    _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_00);
    if ((IteratorCore<Inferences::InductionContext> *)local_400._8_8_ !=
        (IteratorCore<Inferences::InductionContext> *)0x0) {
      operator_delete((void *)local_400._8_8_,auStack_3f0._8_8_ - local_400._8_8_);
    }
    std::
    _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&this_02->_M_h);
    if (local_88._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88._el._indTerms.
                      super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88._el._indTerms.
                            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88._el._indTerms.
                            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&this_01->_M_h);
    if (local_140._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140._indTerms.
                      super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_140._indTerms.
                            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_140._indTerms.
                            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_240._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      if ((long)(int)local_240._0_4_ == 0) {
        *local_240._el._indTerms.super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
         ._M_impl.super__Vector_impl_data._M_finish =
             (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ =
             local_240._el._indTerms.
             super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        uVar12 = (long)(int)local_240._0_4_ * 0x10;
        if (uVar12 < 0x11) {
          *local_240._el._indTerms.
           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ =
               local_240._el._indTerms.
               super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else if (uVar12 < 0x19) {
          *local_240._el._indTerms.
           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ =
               local_240._el._indTerms.
               super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else if (uVar12 < 0x21) {
          *local_240._el._indTerms.
           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ =
               local_240._el._indTerms.
               super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else if (uVar12 < 0x31) {
          *local_240._el._indTerms.
           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ =
               local_240._el._indTerms.
               super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else if (uVar12 < 0x41) {
          *local_240._el._indTerms.
           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ =
               local_240._el._indTerms.
               super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        else {
          operator_delete(local_240._el._indTerms.
                          super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,0x10);
        }
      }
    }
    std::
    _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_390 + 0x18));
    if ((Term *)local_390._0_8_ != (Term *)0x0) {
      operator_delete((void *)local_390._0_8_,local_390._16_8_ - local_390._0_8_);
    }
  }
  else {
    ::Lib::VirtualIterator<Inferences::InductionContext>::getEmpty();
    ppTVar4 = (in_RDX->super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((((ulong)((long)(in_RDX->super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) < 9) &&
        (*(int *)((arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 1) != 0)) &&
       (local_408 = *ppTVar4, (*(uint *)&local_408->field_0xc & 0xfffffff) != 0)) {
      while( true ) {
        cVar7 = (**(code **)&(*in_RDX[1].
                               super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_weight)();
        if (cVar7 == '\0') break;
        (**(code **)&(*in_RDX[1].super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_maxRedLen)(local_400);
        uVar6 = auStack_3f0._0_8_;
        if ((((Term *)local_400._0_8_ != (Term *)0x0) &&
            ((IteratorCore<Inferences::InductionContext> *)local_400._8_8_ !=
             (IteratorCore<Inferences::InductionContext> *)0x0)) &&
           (*(int *)(_func_int ***)local_400._8_8_ = *(int *)(_func_int ***)local_400._8_8_ + -1,
           *(int *)(_func_int ***)local_400._8_8_ == 0)) {
          (**(code **)(*(long *)local_400._0_8_ + 8))();
          if ((IteratorCore<Inferences::InductionContext> *)local_400._8_8_ !=
              (IteratorCore<Inferences::InductionContext> *)0x0) {
            *(_func_int ***)local_400._8_8_ =
                 (_func_int **)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_400._8_8_;
          }
        }
        if (((uVar13 == (*(uint *)(*(pointer *)(uVar6 + 0x18) + 1) >> 0x15 & 0x1f)) &&
            (*(pointer *)(uVar6 + 0x18) !=
             (arg->first).super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
             _M_impl.super__Vector_impl_data._M_start)) &&
           (term = (Term *)(arg->first).
                           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,
           term->_functor == *(uint *)(*(long *)(uVar6 + 0x10) + 8))) {
          Kernel::SubtermIterator::SubtermIterator(&local_268,term);
          Kernel::SubtermIterator::SubtermIterator(&local_2e8,*(Term **)(uVar6 + 0x10));
          bVar9 = false;
          do {
            bVar8 = Kernel::SubtermIterator::hasNext(&local_268);
            if (!bVar8) break;
            Kernel::SubtermIterator::hasNext(&local_2e8);
            bVar8 = true;
            local_268._used = true;
            local_400._0_8_ =
                 (*(TermList ***)
                   ((long)local_268._stack._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                          _M_head_impl + 0x10))[-1]->_content;
            local_2e8._used = true;
            local_390._0_8_ =
                 (*(TermList ***)
                   ((long)local_2e8._stack._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                          _M_head_impl + 0x10))[-1]->_content;
            if (local_400._0_8_ != local_390._0_8_) {
              bVar8 = false;
              bVar10 = !bVar9;
              bVar9 = false;
              if (bVar10) {
                bVar9 = Kernel::TermList::containsSubterm
                                  ((TermList *)local_400,(TermList)local_390._0_8_);
                if (!bVar9 || local_408 != (Term *)local_390._0_8_) {
                  bVar10 = Kernel::TermList::containsSubterm
                                     ((TermList *)local_390,(TermList)local_400._0_8_);
                  bVar9 = false;
                  bVar8 = false;
                  if (!bVar10 || local_408 != (Term *)local_400._0_8_) goto LAB_004f8aec;
                }
                Kernel::SubtermIterator::right(&local_268);
                bVar9 = true;
                Kernel::SubtermIterator::right(&local_2e8);
                bVar8 = true;
              }
            }
LAB_004f8aec:
          } while (bVar8);
          if (bVar9) {
            InductionContext::InductionContext
                      (&local_190,in_RDX,
                       (Literal *)
                       (arg->first).
                       super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (Clause *)
                       (arg->first).
                       super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
            InductionContext::insert
                      (&local_190,*(Clause **)(uVar6 + 0x18),*(Literal **)(uVar6 + 0x10));
            pCVar11 = this->_premise;
            if (pCVar11 != (Clause *)0x0) {
              pIVar2 = &(pCVar11->super_Unit)._inference;
              *(int *)pIVar2 = *(int *)pIVar2 + 1;
            }
            std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::vector
                      ((vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)local_338,
                       &local_190._indTerms);
            local_320._M_buckets = (__buckets_ptr)0x0;
            local_320._M_bucket_count = local_190._cls._M_h._M_bucket_count;
            local_320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_320._M_element_count = local_190._cls._M_h._M_element_count;
            local_400._0_8_ = &((InductionContext *)local_338)->_cls;
            local_320._M_rehash_policy._M_max_load_factor =
                 local_190._cls._M_h._M_rehash_policy._M_max_load_factor;
            local_320._M_rehash_policy._4_4_ = local_190._cls._M_h._M_rehash_policy._4_4_;
            local_320._M_rehash_policy._M_next_resize =
                 local_190._cls._M_h._M_rehash_policy._M_next_resize;
            local_320._M_single_bucket = (__node_base_ptr)0x0;
            std::
            _Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_assign<std::_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,true>>>>
                      ((_Hashtable<Kernel::Clause*,std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>,std::allocator<std::pair<Kernel::Clause*const,Lib::Stack<Kernel::Literal*>>>,std::__detail::_Select1st,std::equal_to<Kernel::Clause*>,Inferences::StlClauseHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_400._0_8_,&local_190._cls._M_h,
                       (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>_>_>
                        *)local_400);
            ::Lib::getSingletonIterator<Inferences::InductionContext>
                      (&local_1e8,(InductionContext *)local_338);
            if (pCVar11 != (Clause *)0x0) {
              pIVar2 = &(pCVar11->super_Unit)._inference;
              *(int *)pIVar2 = *(int *)pIVar2 + 1;
            }
            local_2c0[0] = local_1e8._finished;
            local_2b8 = local_1e8._el._indTerms.
                        super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
            ppTStack_2b0 = local_1e8._el._indTerms.
                           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
            local_2a8 = local_1e8._el._indTerms.
                        super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            local_1e8._el._indTerms.
            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1e8._el._indTerms.
            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1e8._el._indTerms.
            super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_410._core = (IteratorCore<Inferences::InductionContext> *)pCVar11;
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable(&local_2a0,&local_1e8._el._cls);
            local_390[0] = local_2c0[0];
            local_390._8_8_ = local_2b8;
            local_390._16_8_ = ppTStack_2b0;
            local_390._24_8_ = local_2a8;
            local_2a8 = (pointer)0x0;
            local_2b8 = (pointer)0x0;
            ppTStack_2b0 = (pointer)0x0;
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_Hashtable((_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)(local_390 + 0x20),&local_2a0,&local_2a0);
            ::Lib::iterTraits<Lib::SingletonIterator<Inferences::InductionContext>>
                      ((IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_> *)
                       &local_240,(Lib *)local_390,i);
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_390 + 0x20));
            if ((pointer)local_390._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_390._8_8_,local_390._24_8_ - local_390._8_8_);
            }
            ::Lib::
            CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
            ::CatIterator((CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
                           *)local_400,&local_410,
                          (IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_> *)
                          &local_240);
            ::Lib::
            iterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>>>>
                      (&local_f0,(Lib *)local_400,i_00);
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_3d0);
            if ((pointer)auStack_3f0._8_8_ != (pointer)0x0) {
              operator_delete((void *)auStack_3f0._8_8_,(long)local_3d8 - auStack_3f0._8_8_);
            }
            if ((IteratorCore<Inferences::InductionContext> *)local_400._8_8_ !=
                (IteratorCore<Inferences::InductionContext> *)0x0) {
              piVar1 = (int *)(local_400._8_8_ + 8);
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                (*(*(_func_int ***)local_400._8_8_)[1])();
              }
            }
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_240._el._cls._M_h);
            pvVar5 = (void *)CONCAT44(local_240._el._indTerms.
                                      super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_240._el._indTerms.
                                      super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_);
            if (pvVar5 != (void *)0x0) {
              operator_delete(pvVar5,(long)local_240._el._indTerms.
                                           super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar5);
            }
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_2a0);
            if (local_2b8 != (pointer)0x0) {
              operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
            }
            if ((Clause *)local_410._core != (Clause *)0x0) {
              pIVar2 = (Inference *)&(local_410._core)->_refCnt;
              *(int *)pIVar2 = *(int *)pIVar2 + -1;
              if (*(int *)pIVar2 == 0) {
                (**(code **)(*(long *)&(local_410._core)->_vptr_IteratorCore + 8))();
              }
            }
            ::Lib::
            pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>>>>>
                      ((Lib *)&local_398,&local_f0);
            ::Lib::VirtualIterator<Inferences::InductionContext>::operator=
                      ((VirtualIterator<Inferences::InductionContext> *)this,
                       (VirtualIterator<Inferences::InductionContext> *)&local_398);
            if (local_398 != (long *)0x0) {
              plVar3 = local_398 + 1;
              *(int *)plVar3 = (int)*plVar3 + -1;
              if ((int)*plVar3 == 0) {
                (**(code **)(*local_398 + 8))();
              }
            }
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_f0._iter._it2._iter._el._cls._M_h);
            if (local_f0._iter._it2._iter._el._indTerms.
                super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_f0._iter._it2._iter._el._indTerms.
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_f0._iter._it2._iter._el._indTerms.
                                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_f0._iter._it2._iter._el._indTerms.
                                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_f0._iter._it1._core != (IteratorCore<Inferences::InductionContext> *)0x0) {
              piVar1 = &(local_f0._iter._it1._core)->_refCnt;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                (*(local_f0._iter._it1._core)->_vptr_IteratorCore[1])();
              }
            }
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_1e8._el._cls._M_h);
            if (local_1e8._el._indTerms.
                super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1e8._el._indTerms.
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_1e8._el._indTerms.
                                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1e8._el._indTerms.
                                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&(((InductionContext *)local_338)->_cls)._M_h);
            if ((pointer)local_338._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_338._0_8_,local_338._16_8_ - local_338._0_8_);
            }
            if (pCVar11 != (Clause *)0x0) {
              pIVar2 = &(pCVar11->super_Unit)._inference;
              *(int *)pIVar2 = *(int *)pIVar2 + -1;
              if (*(int *)pIVar2 == 0) {
                (**(code **)(*(long *)&pCVar11->super_Unit + 8))();
              }
            }
            std::
            _Hashtable<Kernel::Clause_*,_std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Clause_*>,_Inferences::StlClauseHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_190._cls._M_h);
            if (local_190._indTerms.
                super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_190._indTerms.
                              super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_190._indTerms.
                                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_190._indTerms.
                                    super__Vector_base<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          local_2e8.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
               (_func_int **)&PTR__SubtermIterator_00b69868;
          ::Lib::
          Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(&local_2e8._stack);
          local_268.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
               (_func_int **)&PTR__SubtermIterator_00b69868;
          ::Lib::
          Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled(&local_268._stack);
        }
      }
    }
  }
  return (VirtualIterator<Inferences::InductionContext>)
         (IteratorCore<Inferences::InductionContext> *)this;
}

Assistant:

VirtualIterator<InductionContext> operator()(pair<std::vector<Term*>, VirtualIterator<QueryRes<ResultSubstitutionSP, TermLiteralClause>>> arg) {
    auto indDepth = _premise->inference().inductionDepth();
    // heuristic 2
    if (indDepth) {
      auto res = VirtualIterator<InductionContext>::getEmpty();
      // TODO make this work for multiple induction terms
      ASS(arg.first.size() >= 1)
      if (arg.first.size() > 1) {
        return res;
      }
      auto indTerm = arg.first[0];
      // check for complex term and non-equality
      if (_lit->isEquality() || !indTerm->arity()) {
        return res;
      }
      while (arg.second.hasNext()) {
        auto& tqr = *arg.second.next().data;
        if (indDepth != tqr.clause->inference().inductionDepth()) {
          continue;
        }
        // check for different clauses and same topmost functors
        if (tqr.clause == _premise || _lit->functor() != tqr.literal->functor()) {
          continue;
        }
        bool match = false;
        SubtermIterator sti1(_lit);
        SubtermIterator sti2(tqr.literal);
        while (sti1.hasNext()) {
          ALWAYS(sti2.hasNext());
          auto st1 = sti1.next();
          auto st2 = sti2.next();
          if (st1 != st2) {
            // if the two terms are not equal, we check that
            // - no other non-equal pair of terms have been processed (match)
            // - one of them contains the other and the contained one is the induction term
            if (match ||
              !((st1.containsSubterm(st2) && st2.term() == indTerm) ||
                (st2.containsSubterm(st1) && st1.term() == indTerm)))
            {
              match = false;
              break;
            }
            sti1.right();
            sti2.right();
            match = true;
          }
        }
        if (!match) {
          continue;
        }
        InductionContext ctx(arg.first, _lit, _premise);
        ctx.insert(tqr.clause, tqr.literal);
        res = pvi(concatIters(res, getSingletonIterator(ctx)));
      }
      return res;
    // heuristic 1
    } else {
      InductionContext ctx(arg.first, _lit, _premise);
      Set<Literal*,SharedTermHash> lits;
      lits.insert(_lit);
      while (arg.second.hasNext()) {
        auto& tqr = *arg.second.next().data;
        // TODO: having the same literal multiple times or its complement has unwanted effects
        // in the clausification/resolution part, so avoid it for now
        if (lits.contains(tqr.literal) || lits.contains(Literal::complementaryLiteral(tqr.literal))) {
          continue;
        }
        lits.insert(tqr.literal);
        if (indDepth != tqr.clause->inference().inductionDepth()) {
          continue;
        }
        ctx.insert(tqr.clause, tqr.literal);
      }
      return pvi(getSingletonIterator(ctx));
    }
  }